

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t fast_union_uint16(uint16_t *set_1,size_t size_1,uint16_t *set_2,size_t size_2,
                        uint16_t *buffer)

{
  uint uVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint16_t *puVar4;
  uint32_t length1;
  
  uVar1 = croaring_hardware_support();
  if ((uVar1 & 1) != 0) {
    length1 = (uint32_t)size_2;
    puVar4 = set_1;
    uVar2 = (uint32_t)size_1;
    if (size_1 < size_2) {
      puVar4 = set_2;
      set_2 = set_1;
      uVar2 = length1;
      length1 = (uint32_t)size_1;
    }
    uVar2 = union_vector16(set_2,length1,puVar4,uVar2,buffer);
    return (ulong)uVar2;
  }
  sVar3 = size_1;
  puVar4 = set_1;
  if (size_1 < size_2) {
    sVar3 = size_2;
    puVar4 = set_2;
    size_2 = size_1;
    set_2 = set_1;
  }
  sVar3 = union_uint16(set_2,size_2,puVar4,sVar3,buffer);
  return sVar3;
}

Assistant:

size_t fast_union_uint16(const uint16_t *set_1, size_t size_1,
                         const uint16_t *set_2, size_t size_2,
                         uint16_t *buffer) {
#if CROARING_IS_X64
    if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
        // compute union with smallest array first
        if (size_1 < size_2) {
            return union_vector16(set_1, (uint32_t)size_1, set_2,
                                  (uint32_t)size_2, buffer);
        } else {
            return union_vector16(set_2, (uint32_t)size_2, set_1,
                                  (uint32_t)size_1, buffer);
        }
    } else {
        // compute union with smallest array first
        if (size_1 < size_2) {
            return union_uint16(set_1, size_1, set_2, size_2, buffer);
        } else {
            return union_uint16(set_2, size_2, set_1, size_1, buffer);
        }
    }
#else
    // compute union with smallest array first
    if (size_1 < size_2) {
        return union_uint16(set_1, size_1, set_2, size_2, buffer);
    } else {
        return union_uint16(set_2, size_2, set_1, size_1, buffer);
    }
#endif
}